

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.h
# Opt level: O2

void __thiscall lexical::~lexical(lexical *this)

{
  std::_Rb_tree<Symbol,_Symbol,_std::_Identity<Symbol>,_std::less<Symbol>,_std::allocator<Symbol>_>
  ::~_Rb_tree(&(this->symbols)._M_t);
  std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>::~vector(&this->errors);
  std::vector<Token,_std::allocator<Token>_>::~vector(&this->tokens);
  Table::~Table(&this->table);
  return;
}

Assistant:

lexical() = default;